

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O1

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkTEXS(CB3DMeshFileLoader *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long lVar4;
  pointer pSVar5;
  size_type sVar6;
  pointer pcVar7;
  void *pvVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar10;
  size_type sVar11;
  void *__src;
  SB3dTexture local_78;
  
  lVar4 = *(long *)&(this->super_IMeshLoader).field_0x10;
  iVar3 = *(int *)(lVar4 + -0xc);
  lVar4 = *(long *)(lVar4 + -8);
  iVar9 = (*this->B3DFile->_vptr_IReadFile[3])();
  if (CONCAT44(extraout_var,iVar9) < iVar3 + lVar4) {
    paVar2 = &local_78.TextureName.field_2;
    do {
      local_78.TextureName.field_2._8_8_ = 0;
      local_78.Xscale = 0.0;
      local_78.Yscale = 0.0;
      local_78.Angle = 0.0;
      local_78._60_4_ = 0;
      local_78.Flags = 0;
      local_78.Blend = 0;
      local_78.Xpos = 0.0;
      local_78.Ypos = 0.0;
      local_78.TextureName._M_string_length = 0;
      local_78.TextureName.field_2._M_allocated_capacity = 0;
      local_78.TextureName._M_dataplus._M_p = (pointer)paVar2;
      ::std::vector<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>::
      emplace_back<irr::scene::SB3dTexture>(&(this->Textures).m_data,&local_78);
      (this->Textures).is_sorted = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.TextureName._M_dataplus._M_p != paVar2) {
        operator_delete(local_78.TextureName._M_dataplus._M_p,
                        local_78.TextureName.field_2._M_allocated_capacity + 1);
      }
      pSVar5 = (this->Textures).m_data.
               super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      readString_abi_cxx11_(&local_78.TextureName,this);
      ::std::__cxx11::string::operator=((string *)(pSVar5 + -1),(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.TextureName._M_dataplus._M_p != paVar2) {
        operator_delete(local_78.TextureName._M_dataplus._M_p,
                        local_78.TextureName.field_2._M_allocated_capacity + 1);
      }
      sVar6 = pSVar5[-1].TextureName._M_string_length;
      if (sVar6 != 0) {
        pcVar7 = pSVar5[-1].TextureName._M_dataplus._M_p;
        sVar11 = 0;
        do {
          if (pcVar7[sVar11] == '\\') {
            pcVar7[sVar11] = '/';
          }
          sVar11 = sVar11 + 1;
        } while (sVar6 != sVar11);
      }
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar5[-1].Flags,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar5[-1].Blend,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar5[-1].Xpos,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar5[-1].Ypos,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar5[-1].Xscale,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar5[-1].Yscale,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar5[-1].Angle,4);
      lVar4 = *(long *)&(this->super_IMeshLoader).field_0x10;
      iVar3 = *(int *)(lVar4 + -0xc);
      lVar4 = *(long *)(lVar4 + -8);
      iVar9 = (*this->B3DFile->_vptr_IReadFile[3])();
    } while (CONCAT44(extraout_var_00,iVar9) < iVar3 + lVar4);
  }
  lVar4 = *(long *)&(this->super_IMeshLoader).field_0x8;
  pvVar8 = *(void **)&(this->super_IMeshLoader).field_0x10;
  uVar10 = (long)pvVar8 + (0xffffffff0 - lVar4) & 0xffffffff0;
  __src = (void *)(lVar4 + uVar10 + 0x10);
  if (__src != pvVar8) {
    memmove((void *)(lVar4 + uVar10),__src,(long)pvVar8 - (long)__src);
  }
  puVar1 = &(this->super_IMeshLoader).field_0x10;
  *(long *)puVar1 = *(long *)puVar1 + -0x10;
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkTEXS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkTEXS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		Textures.push_back(SB3dTexture());
		SB3dTexture &B3dTexture = Textures.getLast();

		B3dTexture.TextureName = readString();
		std::replace(B3dTexture.TextureName.begin(), B3dTexture.TextureName.end(), '\\', '/');
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Texture", B3dTexture.TextureName.c_str(), ELL_DEBUG);
#endif

		B3DFile->read(&B3dTexture.Flags, sizeof(s32));
		B3DFile->read(&B3dTexture.Blend, sizeof(s32));
#ifdef __BIG_ENDIAN__
		B3dTexture.Flags = os::Byteswap::byteswap(B3dTexture.Flags);
		B3dTexture.Blend = os::Byteswap::byteswap(B3dTexture.Blend);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Flags", core::stringc(B3dTexture.Flags).c_str(), ELL_DEBUG);
		os::Printer::log("Blend", core::stringc(B3dTexture.Blend).c_str(), ELL_DEBUG);
#endif
		readFloats(&B3dTexture.Xpos, 1);
		readFloats(&B3dTexture.Ypos, 1);
		readFloats(&B3dTexture.Xscale, 1);
		readFloats(&B3dTexture.Yscale, 1);
		readFloats(&B3dTexture.Angle, 1);
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}